

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::verifyBoolean
               (ResultCollector *result,QueriedState *state,bool expected)

{
  GLboolean GVar1;
  DataType DVar2;
  bool *pbVar3;
  uint *puVar4;
  GLint *pGVar5;
  GLint64 *pGVar6;
  GLfloat *pGVar7;
  ostream *poVar8;
  Enum<int,_1UL> EVar9;
  float local_79c;
  string local_6e8;
  ostringstream local_6c8 [8];
  ostringstream buf_3;
  undefined1 local_548 [4];
  GLfloat reference_2;
  ostringstream local_528 [8];
  ostringstream buf_2;
  GLint64 reference_1;
  ostringstream local_388 [8];
  ostringstream buf_1;
  undefined1 local_208 [4];
  GLint reference;
  GetNameFunc local_1e8;
  int local_1e0;
  Enum<int,_1UL> local_1d8;
  GetNameFunc local_1c8;
  int local_1c0;
  Enum<int,_1UL> local_1b8 [2];
  ostringstream local_198 [8];
  ostringstream buf;
  bool expected_local;
  QueriedState *state_local;
  ResultCollector *result_local;
  
  DVar2 = QueriedState::getType(state);
  switch(DVar2) {
  case DATATYPE_BOOLEAN:
    pbVar3 = QueriedState::getBoolAccess(state);
    if ((bool)(*pbVar3 & 1U) != expected) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar8 = std::operator<<((ostream *)local_198,"Expected ");
      GVar1 = mapBoolToGLBoolean(expected);
      EVar9 = glu::getBooleanStr(GVar1);
      local_1c8 = EVar9.m_getName;
      local_1c0 = EVar9.m_value;
      local_1b8[0].m_getName = local_1c8;
      local_1b8[0].m_value = local_1c0;
      poVar8 = tcu::Format::operator<<(poVar8,local_1b8);
      poVar8 = std::operator<<(poVar8,", got ");
      pbVar3 = QueriedState::getBoolAccess(state);
      GVar1 = mapBoolToGLBoolean((bool)(*pbVar3 & 1));
      EVar9 = glu::getBooleanStr(GVar1);
      local_1e8 = EVar9.m_getName;
      local_1e0 = EVar9.m_value;
      local_1d8.m_getName = local_1e8;
      local_1d8.m_value = local_1e0;
      tcu::Format::operator<<(poVar8,&local_1d8);
      std::__cxx11::ostringstream::str();
      tcu::ResultCollector::fail(result,(string *)local_208);
      std::__cxx11::string::~string((string *)local_208);
      std::__cxx11::ostringstream::~ostringstream(local_198);
    }
    break;
  case DATATYPE_INTEGER:
    puVar4 = (uint *)QueriedState::getIntAccess(state);
    if (*puVar4 != (uint)expected) {
      std::__cxx11::ostringstream::ostringstream(local_388);
      poVar8 = std::operator<<((ostream *)local_388,"Expected ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)expected);
      poVar8 = std::operator<<(poVar8,", got ");
      pGVar5 = QueriedState::getIntAccess(state);
      std::ostream::operator<<(poVar8,*pGVar5);
      std::__cxx11::ostringstream::str();
      tcu::ResultCollector::fail(result,(string *)&reference_1);
      std::__cxx11::string::~string((string *)&reference_1);
      std::__cxx11::ostringstream::~ostringstream(local_388);
    }
    break;
  case DATATYPE_INTEGER64:
    pGVar6 = QueriedState::getInt64Access(state);
    if (*pGVar6 != (long)(int)(uint)expected) {
      std::__cxx11::ostringstream::ostringstream(local_528);
      poVar8 = std::operator<<((ostream *)local_528,"Expected ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(long)(int)(uint)expected);
      poVar8 = std::operator<<(poVar8,", got ");
      pGVar6 = QueriedState::getInt64Access(state);
      std::ostream::operator<<(poVar8,*pGVar6);
      std::__cxx11::ostringstream::str();
      tcu::ResultCollector::fail(result,(string *)local_548);
      std::__cxx11::string::~string((string *)local_548);
      std::__cxx11::ostringstream::~ostringstream(local_528);
    }
    break;
  case DATATYPE_FLOAT:
    local_79c = 1.0;
    if (!expected) {
      local_79c = 0.0;
    }
    pGVar7 = QueriedState::getFloatAccess(state);
    if ((*pGVar7 != local_79c) || (NAN(*pGVar7) || NAN(local_79c))) {
      std::__cxx11::ostringstream::ostringstream(local_6c8);
      poVar8 = std::operator<<((ostream *)local_6c8,"Expected ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_79c);
      poVar8 = std::operator<<(poVar8,", got ");
      pGVar7 = QueriedState::getFloatAccess(state);
      std::ostream::operator<<(poVar8,*pGVar7);
      std::__cxx11::ostringstream::str();
      tcu::ResultCollector::fail(result,&local_6e8);
      std::__cxx11::string::~string((string *)&local_6e8);
      std::__cxx11::ostringstream::~ostringstream(local_6c8);
    }
  }
  return;
}

Assistant:

void verifyBoolean (tcu::ResultCollector& result, QueriedState& state, bool expected)
{
	switch (state.getType())
	{
		case DATATYPE_BOOLEAN:
		{
			if (state.getBoolAccess() != expected)
			{
				std::ostringstream buf;
				buf << "Expected " << glu::getBooleanStr(mapBoolToGLBoolean(expected)) << ", got " << glu::getBooleanStr(mapBoolToGLBoolean(state.getBoolAccess()));
				result.fail(buf.str());
			}
			break;
		}

		case DATATYPE_INTEGER:
		{
			const glw::GLint reference = expected ? 1 : 0;
			if (state.getIntAccess() != reference)
			{
				std::ostringstream buf;
				buf << "Expected " << reference << ", got " << state.getIntAccess();
				result.fail(buf.str());
			}
			break;
		}

		case DATATYPE_INTEGER64:
		{
			const glw::GLint64 reference = expected ? 1 : 0;
			if (state.getInt64Access() != reference)
			{
				std::ostringstream buf;
				buf << "Expected " << reference << ", got " << state.getInt64Access();
				result.fail(buf.str());
			}
			break;
		}

		case DATATYPE_FLOAT:
		{
			const glw::GLfloat reference = expected ? 1.0f : 0.0f;
			if (state.getFloatAccess() != reference)
			{
				std::ostringstream buf;
				buf << "Expected " << reference << ", got " << state.getFloatAccess();
				result.fail(buf.str());
			}
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}